

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

bool __thiscall
ON_RenderContentPrivate::AddChild(ON_RenderContentPrivate *this,ON_RenderContent *child)

{
  ON_RenderContentPrivate **ppOVar1;
  ON_RenderContentPrivate *pOVar2;
  ON_RenderContent **ppOVar3;
  ON_RenderContent *pOVar4;
  
  pOVar2 = child->_private;
  if (((pOVar2->m_model == (ONX_Model *)0x0) && (pOVar2->m_parent == (ON_RenderContent *)0x0)) &&
     (pOVar2->m_next_sibling == (ON_RenderContent *)0x0)) {
    pOVar4 = this->m_first_child;
    if (pOVar4 == (ON_RenderContent *)0x0) {
      ppOVar3 = &this->m_first_child;
    }
    else {
      do {
        ppOVar1 = &pOVar4->_private;
        pOVar4 = (*ppOVar1)->m_next_sibling;
      } while (pOVar4 != (ON_RenderContent *)0x0);
      ppOVar3 = &(*ppOVar1)->m_next_sibling;
    }
    *ppOVar3 = child;
    pOVar2->m_next_sibling = (ON_RenderContent *)0x0;
    pOVar2->m_parent = this->m_render_content;
    return true;
  }
  return false;
}

Assistant:

bool ON_RenderContentPrivate::AddChild(ON_RenderContent& child)
{
  if ((nullptr != child._private->m_model) || (nullptr != child._private->m_parent) || (nullptr != child._private->m_next_sibling))
    return false;

  if (nullptr == m_first_child)
  {
    m_first_child = &child;
  }
  else
  {
    ON_RenderContent* last_child = FindLastChild();
    if (nullptr == last_child)
      return false;

    last_child->_private->m_next_sibling = &child;
  }

  child._private->m_next_sibling = nullptr;
  child._private->m_parent = &m_render_content;

  return true;
}